

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

Point * __thiscall p2t::Sweep::NextFlipPoint(Sweep *this,Point *ep,Point *eq,Triangle *ot,Point *op)

{
  Orientation OVar1;
  Point *pPVar2;
  runtime_error *this_00;
  
  OVar1 = Orient2d(eq,op,ep);
  if (OVar1 == CCW) {
    pPVar2 = Triangle::PointCW(ot,op);
    return pPVar2;
  }
  if (OVar1 == CW) {
    pPVar2 = Triangle::PointCCW(ot,op);
    return pPVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"[Unsupported] Opposing point on constrained edge");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Point& Sweep::NextFlipPoint(Point& ep, Point& eq, Triangle& ot, Point& op)
{
  Orientation o2d = Orient2d(eq, op, ep);
  if (o2d == CW) {
    // Right
    return *ot.PointCCW(op);
  } else if (o2d == CCW) {
    // Left
    return *ot.PointCW(op);
  }
  throw std::runtime_error("[Unsupported] Opposing point on constrained edge");
}